

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall cmValueWithOrigin::~cmValueWithOrigin(cmValueWithOrigin *this)

{
  cmValueWithOrigin *this_local;
  
  cmListFileBacktrace::~cmListFileBacktrace(&this->Backtrace);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmValueWithOrigin(const std::string &value,
                          const cmListFileBacktrace &bt)
    : Value(value), Backtrace(bt)
  {}